

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_simd.cpp
# Opt level: O0

void simd::Threshold(Image *in,uint32_t startXIn,uint32_t startYIn,Image *out,uint32_t startXOut,
                    uint32_t startYOut,uint32_t width,uint32_t height,uint8_t minThreshold,
                    uint8_t maxThreshold,SIMDType simdType)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint uVar3;
  uchar *puVar4;
  Image *in_RCX;
  undefined4 in_EDX;
  uint32_t unaff_EBX;
  undefined4 in_ESI;
  ImageTemplate<unsigned_char> *in_RDI;
  uint32_t in_R8D;
  uint32_t in_R9D;
  uint32_t unaff_retaddr;
  uint8_t uStack0000000000000008;
  uint8_t uStack0000000000000010;
  uint8_t in_stack_00000018;
  SIMDType in_stack_00000020;
  SIMDType in_stack_00000028;
  uint32_t nonSimdWidth;
  uint32_t totalSimdWidth;
  uint32_t simdWidth;
  uint8_t *outYEnd;
  uint8_t *outY;
  uint8_t *inY;
  uint32_t rowSizeOut;
  uint32_t rowSizeIn;
  uint8_t in_stack_0000009f;
  uint8_t *in_stack_000000a0;
  uint8_t *in_stack_000000a8;
  uint8_t *in_stack_000000b0;
  uint32_t in_stack_000000b8;
  uint32_t in_stack_000000bc;
  uint8_t in_stack_000000d0;
  uint32_t in_stack_000000d8;
  uint32_t simdSize;
  undefined4 in_stack_fffffffffffffefc;
  int iVar5;
  undefined4 in_stack_ffffffffffffff04;
  uint32_t in_stack_ffffffffffffff18;
  uint32_t in_stack_ffffffffffffff1c;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffff20;
  undefined8 in_stack_ffffffffffffff28;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffff30;
  uint8_t minThreshold_00;
  uint8_t *outYEnd_00;
  uint32_t in_stack_ffffffffffffff40;
  uint32_t in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffff50;
  uint32_t *in_stack_ffffffffffffff58;
  uint32_t *in_stack_ffffffffffffff60;
  uint8_t local_58 [32];
  uint32_t in_stack_ffffffffffffffc8;
  uint32_t in_stack_ffffffffffffffcc;
  uint32_t in_stack_ffffffffffffffd0;
  ImageTemplate<unsigned_char> *this;
  
  uVar1 = getSimdSize(in_stack_00000028);
  if ((in_stack_00000028 == cpu_function) || (_uStack0000000000000008 < uVar1)) {
    if (in_stack_00000028 == avx_function) {
      Threshold((Image *)CONCAT44(in_ESI,in_EDX),(uint32_t)((ulong)in_RCX >> 0x20),(uint32_t)in_RCX,
                (Image *)CONCAT44(in_R8D,in_R9D),uVar1,in_stack_ffffffffffffffd0,unaff_retaddr,
                _uStack0000000000000008,uStack0000000000000010,in_stack_00000018,in_stack_00000020);
    }
    else {
      Image_Function::Threshold
                (in_RCX,in_R8D,in_R9D,(Image *)CONCAT44(uVar1,in_stack_ffffffffffffffd0),
                 in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8,(uint32_t)in_RDI,unaff_EBX,
                 (uint8_t)unaff_retaddr,uStack0000000000000008);
    }
  }
  else {
    uVar3 = _uStack0000000000000008;
    iVar5 = _uStack0000000000000010;
    Image_Function::ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
              (in_stack_ffffffffffffff30,(uint32_t)((ulong)in_stack_ffffffffffffff28 >> 0x20),
               (uint32_t)in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
               in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18,in_stack_ffffffffffffff40,
               in_stack_ffffffffffffff48);
    outYEnd_00 = local_58;
    this = in_RDI;
    PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
              ((ImageTemplate<unsigned_char> *)CONCAT44(in_stack_ffffffffffffff04,iVar5),
               (ImageTemplate<unsigned_char> *)CONCAT44(in_stack_fffffffffffffefc,uVar3));
    minThreshold_00 = (uint8_t)((ulong)in_RDI >> 0x38);
    Image_Function::
    VerifyGrayScaleImage<PenguinV_Image::ImageTemplate<unsigned_char>,PenguinV_Image::ImageTemplate<unsigned_char>>
              ((ImageTemplate<unsigned_char> *)CONCAT44(in_stack_ffffffffffffff04,iVar5),
               (ImageTemplate<unsigned_char> *)CONCAT44(in_stack_fffffffffffffefc,uVar3));
    PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
              ((ImageTemplate<unsigned_char> *)0x15f764);
    PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
              ((ImageTemplate<unsigned_char> *)CONCAT44(in_stack_ffffffffffffff04,iVar5),
               (ImageTemplate<unsigned_char> *)CONCAT44(in_stack_fffffffffffffefc,uVar3));
    Image_Function::
    OptimiseRoi<PenguinV_Image::ImageTemplate<unsigned_char>,PenguinV_Image::ImageTemplate<unsigned_char>>
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
               (ImageTemplate<unsigned_char> *)
               CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
              ((ImageTemplate<unsigned_char> *)0x15f7b3);
    PenguinV_Image::ImageTemplate<unsigned_char>::rowSize(this);
    uVar2 = PenguinV_Image::ImageTemplate<unsigned_char>::rowSize(in_RCX);
    PenguinV_Image::ImageTemplate<unsigned_char>::data(this);
    puVar4 = PenguinV_Image::ImageTemplate<unsigned_char>::data(in_RCX);
    uVar3 = _uStack0000000000000008 / uVar1;
    uVar1 = uVar3 * uVar1;
    if (in_stack_00000028 == avx_function) {
      avx::Threshold(in_stack_000000bc,in_stack_000000b8,in_stack_000000b0,in_stack_000000a8,
                     in_stack_000000a0,in_stack_0000009f,(uint8_t)uVar3,uVar1,
                     _uStack0000000000000008 - uVar1,in_stack_ffffffffffffff18);
    }
    else if (in_stack_00000028 == sse_function) {
      sse::Threshold((uint32_t)
                     ((ulong)(puVar4 + (ulong)(_uStack0000000000000010 * uVar2) +
                                       (ulong)in_R8D + (ulong)(in_R9D * uVar2)) >> 0x20),
                     (uint32_t)
                     (puVar4 + (ulong)(_uStack0000000000000010 * uVar2) +
                               (ulong)in_R8D + (ulong)(in_R9D * uVar2)),
                     (uint8_t *)CONCAT44(uVar3,uVar1),
                     (uint8_t *)CONCAT44(_uStack0000000000000008 - uVar1,in_stack_ffffffffffffff40),
                     outYEnd_00,minThreshold_00,in_stack_000000d0,in_stack_000000d8,startYOut,
                     (uint32_t)out);
    }
  }
  return;
}

Assistant:

void Threshold( const Image & in, uint32_t startXIn, uint32_t startYIn, Image & out, uint32_t startXOut, uint32_t startYOut,
                    uint32_t width, uint32_t height, uint8_t minThreshold, uint8_t maxThreshold, SIMDType simdType )
    {
        const uint32_t simdSize = getSimdSize( simdType );

        if( (simdType == cpu_function) || (width < simdSize) ) {
            AVX_CODE( Threshold( in, startXIn, startYIn, out, startXOut, startYOut, width, height, minThreshold, maxThreshold, sse_function ); )

            Image_Function::Threshold( in, startXIn, startYIn, out, startXOut, startYOut, width, height, minThreshold, maxThreshold );
            return;
        }

        Image_Function::ParameterValidation( in, startXIn, startYIn, out, startXOut, startYOut, width, height );
        Image_Function::VerifyGrayScaleImage( in, out );

        Image_Function::OptimiseRoi( width, height, in, out );

        const uint32_t rowSizeIn  = in.rowSize();
        const uint32_t rowSizeOut = out.rowSize();

        const uint8_t * inY  = in.data()  + startYIn  * rowSizeIn  + startXIn;
        uint8_t       * outY = out.data() + startYOut * rowSizeOut + startXOut;

        const uint8_t * outYEnd = outY + height * rowSizeOut;

        const uint32_t simdWidth = width / simdSize;
        const uint32_t totalSimdWidth = simdWidth * simdSize;
        const uint32_t nonSimdWidth = width - totalSimdWidth;

        AVX_CODE( avx::Threshold( rowSizeIn, rowSizeOut, inY, outY, outYEnd, minThreshold, maxThreshold, simdWidth, totalSimdWidth, nonSimdWidth ); )
        SSE_CODE( sse::Threshold( rowSizeIn, rowSizeOut, inY, outY, outYEnd, minThreshold, maxThreshold, simdWidth, totalSimdWidth, nonSimdWidth ); )
        NEON_CODE( neon::Threshold( rowSizeIn, rowSizeOut, inY, outY, outYEnd, minThreshold, maxThreshold, simdWidth, totalSimdWidth, nonSimdWidth ); )
    }